

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O2

size_t log_map_hash_fnv1(char *key)

{
  size_t sVar1;
  
  sVar1 = 0x811c9dc5;
  for (; (long)*key != 0; key = key + 1) {
    sVar1 = sVar1 * 0x1000193 ^ (long)*key;
  }
  return sVar1;
}

Assistant:

static size_t log_map_hash_fnv1(const char *key)
{
	size_t hash = ((size_t)0x811C9DC5);

	const char *iterator = key;

	while (*iterator != '\0')
	{
		hash = (((size_t)0x01000193) * hash) ^ (*iterator);

		++iterator;
	}

	return hash;
}